

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O1

string * __thiscall
LinearSystem::ToString_abi_cxx11_(string *__return_storage_ptr__,LinearSystem *this)

{
  pointer pOVar1;
  char cVar2;
  string *psVar3;
  int iVar4;
  Matrix *this_00;
  Operation *operation;
  pointer pOVar5;
  SwapMatrix swaps;
  ostringstream out;
  LinearSystem current_system;
  SwapMatrix local_308;
  string *local_2f0;
  ExtendedMatrix *local_2e8;
  long local_2e0 [14];
  ios_base local_270 [264];
  LinearSystem local_168;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e0);
  LinearSystem(&local_168,&this->start_system_,this->mode_);
  local_2f0 = __return_storage_ptr__;
  operator<<((ostream *)local_2e0,&local_168.system_);
  local_308.first_row_ = 0;
  local_308.second_row_ = 0;
  local_308.first_main_column_ = 0;
  local_308.second_main_column_ = 0;
  local_308.first_extension_column_ = 0;
  local_308.second_extension_column_ = 0;
  pOVar5 = (this->history_).
           super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this->history_).
           super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar5 != pOVar1) {
    local_2e8 = &this->system_;
    do {
      ApplyOperation(&local_168,pOVar5->operation_type,pOVar5->lhs,pOVar5->rhs,pOVar5->coefficient);
      if (pOVar5->operation_type == SwapColumns) {
        local_308.first_main_column_ = pOVar5->lhs + 1;
        local_308.second_main_column_ = pOVar5->rhs + 1;
      }
      else if (pOVar5->operation_type == SwapRows) {
        local_308.first_row_ = pOVar5->lhs + 1;
        local_308.second_row_ = pOVar5->rhs + 1;
        if (this->mode_ == LU) {
          this_00 = ExtendedMatrix::GetMainMatrix(local_2e8);
          iVar4 = Matrix::GetNumColumns(this_00);
          local_308.first_extension_column_ = pOVar5->lhs + iVar4 + 1;
          local_308.second_extension_column_ = iVar4 + 1 + pOVar5->rhs;
        }
      }
      if ((Options::step_by_step_type == 2) ||
         ((Options::step_by_step_type == 1 && (pOVar5->operation_type == MainOutput)))) {
        cVar2 = (char)(ostream *)local_2e0;
        std::ios::widen((char)*(undefined8 *)(local_2e0[0] + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        if ((local_308.first_row_ != local_308.second_row_) ||
           ((local_308.first_main_column_ != local_308.second_main_column_ ||
            (local_308.first_extension_column_ != local_308.second_extension_column_)))) {
          operator<<((ostream *)local_2e0,&local_308);
          std::ios::widen((char)*(undefined8 *)(local_2e0[0] + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          local_308.first_row_ = 0;
          local_308.second_row_ = 0;
          local_308.first_main_column_ = 0;
          local_308.second_main_column_ = 0;
          local_308.first_extension_column_ = 0;
          local_308.second_extension_column_ = 0;
        }
        operator<<((ostream *)local_2e0,&local_168.system_);
      }
      pOVar5 = pOVar5 + 1;
    } while (pOVar5 != pOVar1);
  }
  psVar3 = local_2f0;
  std::__cxx11::stringbuf::str();
  ~LinearSystem(&local_168);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e0);
  std::ios_base::~ios_base(local_270);
  return psVar3;
}

Assistant:

std::string LinearSystem::ToString() const {
  std::ostringstream out;
  LinearSystem current_system(start_system_, mode_);
  out << current_system.system_;
  SwapMatrix swaps;
  for (const auto& operation : history_) {
    current_system.ApplyOperation(operation);

    if (operation.operation_type == OperationType::SwapRows) {
      swaps.SetRowSwap(operation.lhs, operation.rhs);
      if (mode_ == Mode::LU) {
        int m = system_.GetMainMatrix().GetNumColumns();
        swaps.SetExtensionColumnSwap(operation.lhs + m, operation.rhs + m);
      }
    } else if (operation.operation_type == OperationType::SwapColumns) {
      swaps.SetMainColumnSwap(operation.lhs, operation.rhs);
    }

    if (Options::step_by_step_type != Options::StepByStepType::AllSteps &&
        (Options::step_by_step_type != Options::StepByStepType::MainSteps ||
            operation.operation_type != OperationType::MainOutput)) {
      continue;
    }

    out << std::endl;

    if (!swaps.IsEmpty()) {
      out << swaps << std::endl;
      swaps.Clear();
    }

    out << current_system.system_;
  }

  return out.str();
}